

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

int __thiscall cmXMLParser::ParseFile(cmXMLParser *this,char *file)

{
  int iVar1;
  ostringstream str;
  ifstream ifs;
  long *local_3b8;
  long local_3a8 [2];
  ostringstream local_398 [112];
  ios_base local_328 [264];
  long local_220 [2];
  streambuf local_210 [16];
  byte abStack_200 [488];
  
  if (file == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    std::ifstream::ifstream(local_220,file,_S_in);
    iVar1 = 0;
    if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      std::ostream::operator<<(local_398,local_210);
      std::__cxx11::stringbuf::str();
      iVar1 = (*this->_vptr_cmXMLParser[2])(this,local_3b8);
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,local_3a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_398);
      std::ios_base::~ios_base(local_328);
    }
    std::ifstream::~ifstream(local_220);
  }
  return iVar1;
}

Assistant:

int cmXMLParser::ParseFile(const char* file)
{
  if ( !file )
    {
    return 0;
    }

  cmsys::ifstream ifs(file);
  if ( !ifs )
    {
    return 0;
    }

  std::ostringstream str;
  str << ifs.rdbuf();
  return this->Parse(str.str().c_str());
}